

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *stream,QCborValue *value)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_68;
  QCborValue local_48;
  QCborParserError local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char *)0x0;
  local_68.size = 0;
  operator>>(stream,(QByteArray *)&local_68);
  local_30.offset = 0;
  local_30.error.c = NoError;
  local_30._12_4_ = 0xaaaaaaaa;
  QCborValue::fromCbor(&local_48,(QByteArray *)&local_68,&local_30);
  QCborValue::operator=((QCborValue *)value,&local_48);
  QCborValue::~QCborValue((QCborValue *)&local_48);
  if (local_30.error.c != NoError) {
    QDataStream::setStatus(stream,ReadCorruptData);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QCborValue &value)
{
    QByteArray buffer;
    stream >> buffer;
    QCborParserError parseError{};
    value = QCborValue::fromCbor(buffer, &parseError);
    if (parseError.error)
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}